

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckOperator.cxx
# Opt level: O2

bool __thiscall
kws::Parser::FindOperator
          (Parser *this,char *op,uint before,uint after,unsigned_long maxSize,
          bool doNotCheckInsideParenthesis)

{
  size_t pos;
  string *psVar1;
  string *this_00;
  char cVar2;
  bool bVar3;
  byte bVar4;
  size_t pos_00;
  long lVar5;
  unsigned_long uVar6;
  size_t sVar7;
  char *__s;
  size_t sVar8;
  ulong uVar9;
  uint local_100;
  uint local_fc;
  string currentLine;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  string local_90;
  string previousLine;
  string local_50;
  
  psVar1 = &this->m_BufferNoComment;
  pos_00 = std::__cxx11::string::find((char *)psVar1,(ulong)op);
  bVar4 = 0;
  do {
    if (pos_00 == 0xffffffffffffffff) {
      return (bool)(~bVar4 & 1);
    }
    local_100 = 0;
    sVar8 = pos_00;
    do {
      while( true ) {
        bVar3 = true;
        if ((long)sVar8 < 2) goto LAB_001450ca;
        pos = sVar8 - 1;
        cVar2 = (psVar1->_M_dataplus)._M_p[sVar8 - 1];
        if ((cVar2 == '\n') || (cVar2 == '\r')) break;
        if (cVar2 != ' ') goto LAB_001450ca;
        local_100 = local_100 + 1;
        sVar8 = pos;
      }
      lVar5 = GetLineNumber(this,pos,true);
      GetLine_abi_cxx11_(&currentLine,this,lVar5 - 1);
      uVar6 = GetLineNumber(this,pos,true);
      GetLine_abi_cxx11_(&previousLine,this,uVar6);
      uVar9 = previousLine._M_string_length + currentLine._M_string_length;
      std::__cxx11::string::~string((string *)&previousLine);
      std::__cxx11::string::~string((string *)&currentLine);
      sVar8 = sVar8 - 1;
    } while (uVar9 <= maxSize);
    bVar3 = false;
LAB_001450ca:
    sVar7 = strlen(op);
    local_fc = 0;
    for (sVar8 = sVar7 + pos_00; (long)sVar8 < (long)(this->m_BufferNoComment)._M_string_length;
        sVar8 = sVar8 + 1) {
      cVar2 = (psVar1->_M_dataplus)._M_p[sVar8];
      if (cVar2 == '\n') {
LAB_00145109:
        lVar5 = GetLineNumber(this,sVar8,true);
        GetLine_abi_cxx11_(&currentLine,this,lVar5 - 1);
        uVar6 = GetLineNumber(this,sVar8,true);
        GetLine_abi_cxx11_(&previousLine,this,uVar6);
        uVar9 = previousLine._M_string_length + currentLine._M_string_length;
        std::__cxx11::string::~string((string *)&previousLine);
        std::__cxx11::string::~string((string *)&currentLine);
        if (maxSize < uVar9) goto LAB_00145205;
      }
      else {
        if (cVar2 != ' ') {
          if (cVar2 == '\r') goto LAB_00145109;
          break;
        }
        local_fc = local_fc + 1;
      }
    }
    if (((bVar3) && (local_fc != after || local_100 != before)) &&
       (lVar5 = std::__cxx11::string::find((char *)psVar1,0x162e5b),
       pos_00 != lVar5 + 8U && doNotCheckInsideParenthesis)) {
      std::__cxx11::string::string((string *)&local_90,"",(allocator *)&currentLine);
      bVar3 = IsBetweenCharsFast(this,'(',')',pos_00,false,&local_90);
      if (bVar3) {
        std::__cxx11::string::~string((string *)&local_90);
      }
      else {
        std::__cxx11::string::string((string *)&local_50,"",(allocator *)&previousLine);
        bVar3 = IsBetweenQuote(this,pos_00,false,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&local_90);
        if (!bVar3) {
          currentLine.field_2._8_8_ = &local_a0;
          local_a0._M_local_buf[0] = '\0';
          this_00 = (string *)(currentLine.field_2._M_local_buf + 8);
          currentLine._M_dataplus._M_p = (pointer)GetLineNumber(this,pos_00,true);
          currentLine.field_2._M_allocated_capacity = 0x17;
          currentLine._M_string_length = (size_type)currentLine._M_dataplus._M_p;
          std::__cxx11::string::assign((char *)this_00);
          std::__cxx11::string::append((char *)this_00);
          __s = (char *)operator_new__(10);
          snprintf(__s,10,"%d",(ulong)local_100);
          std::__cxx11::string::append((char *)this_00);
          std::__cxx11::string::append((char *)this_00);
          snprintf(__s,10,"%d",(ulong)before);
          std::__cxx11::string::append((char *)this_00);
          std::__cxx11::string::append((char *)this_00);
          snprintf(__s,10,"%d",(ulong)local_fc);
          std::__cxx11::string::append((char *)this_00);
          std::__cxx11::string::append((char *)this_00);
          snprintf(__s,10,"%d",(ulong)after);
          std::__cxx11::string::append((char *)this_00);
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,(value_type *)&currentLine);
          operator_delete__(__s);
          std::__cxx11::string::~string(this_00);
          bVar4 = 1;
        }
      }
    }
LAB_00145205:
    pos_00 = std::__cxx11::string::find((char *)psVar1,(ulong)op);
  } while( true );
}

Assistant:

bool Parser::FindOperator(const char* op,unsigned int before, 
                          unsigned int after,
                          unsigned long maxSize,
                          bool doNotCheckInsideParenthesis
                          )
{
  bool hasErrors = false;
  long int pos = 0;
  size_t operatorPos = m_BufferNoComment.find(op,pos);
  while(operatorPos != std::string::npos) 
    {
    bool showError=true;
    // Check number of space before
    unsigned int bef = 0;
    long int i = static_cast<long int>(operatorPos)-1;
    while((i>0) && ((m_BufferNoComment[i] == ' ')
       || (m_BufferNoComment[i] == '\r')
       || (m_BufferNoComment[i] == '\n'))
       )
      {
      if((m_BufferNoComment[i] != '\r')
       && (m_BufferNoComment[i] != '\n'))
        {
        bef++;
        }
      else
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string previousLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum = static_cast<unsigned long>(currentLine.size() +
                                              previousLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      i--;
      }

    // Check number of space after
    unsigned int aft = 0;
    i = static_cast<long int>(operatorPos+strlen(op));
    while((i<(long int)m_BufferNoComment.size())
           && ((m_BufferNoComment[i] == ' ')
           || (m_BufferNoComment[i] == '\r')
           || (m_BufferNoComment[i] == '\n')
           )
           )
      {
      if((m_BufferNoComment[i] == '\r')
        || (m_BufferNoComment[i] == '\n'))
        {
        // check if the sum of the two lines is higher than the maximum length
        std::string currentLine = this->GetLine(this->GetLineNumber(i,true)-1);
        std::string nextLine = this->GetLine(this->GetLineNumber(i,true));
        auto sum =
            static_cast<unsigned long>(currentLine.size() + nextLine.size());
        if(sum>maxSize)
          {
          showError = false;
          break;
          }
        }
      else
        {
        aft++;
        }
      i++;
      }
   
    if(showError  && (bef != before || aft != after))
      {
      // we make sure that the keyword operator is not defined right before
      if(operatorPos != m_BufferNoComment.find("operator",operatorPos-11)+8
        && (doNotCheckInsideParenthesis && !this->IsBetweenCharsFast('(',')',operatorPos,false)
        && !this->IsBetweenQuote(operatorPos,false)
        ) 
        )
        {
        Error error;
        error.line = this->GetLineNumber(operatorPos,true);
        error.line2 = error.line;
        error.number = OPERATOR;
        error.description = "Spaces around operator are wrong: ";
        error.description += "before = ";
        constexpr size_t length = 10;
        char* val = new char[length];
        snprintf(val,length,"%d",bef);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",before);
        error.description += val;
        error.description += " ,after = ";
        snprintf(val,length,"%d",aft);
        error.description += val;
        error.description += " v.s ";
        snprintf(val,length,"%d",after);
        error.description += val;
        m_ErrorList.push_back(error);
        delete [] val;
        hasErrors = true;
        }
      }
    pos = static_cast<long int>(operatorPos)+1;
    operatorPos = m_BufferNoComment.find(op,operatorPos+1);  
    }
  return !hasErrors;
}